

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall
TApp_Required1SubCom_Test::~TApp_Required1SubCom_Test(TApp_Required1SubCom_Test *this)

{
  TApp::~TApp(&this->super_TApp);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, Required1SubCom) {
    app.require_subcommand(1);
    app.add_subcommand("sub1");
    app.add_subcommand("sub2");
    app.add_subcommand("sub3");

    EXPECT_THROW(run(), CLI::RequiredError);

    app.reset();
    args = {"sub1"};
    run();

    app.reset();
    args = {"sub1", "sub2"};
    EXPECT_THROW(run(), CLI::ExtrasError);
}